

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void addLengthDistance(uivector *values,size_t length,size_t distance)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint extra_distance;
  uint dist_code;
  uint extra_length;
  uint length_code;
  size_t distance_local;
  size_t length_local;
  uivector *values_local;
  
  sVar3 = searchCodeIndex(LENGTHBASE,0x1d,length);
  uVar1 = LENGTHBASE[sVar3 & 0xffffffff];
  sVar4 = searchCodeIndex(DISTANCEBASE,0x1e,distance);
  uVar2 = DISTANCEBASE[sVar4 & 0xffffffff];
  uivector_push_back(values,(int)sVar3 + 0x101);
  uivector_push_back(values,(int)length - uVar1);
  uivector_push_back(values,(uint)sVar4);
  uivector_push_back(values,(int)distance - uVar2);
  return;
}

Assistant:

static void addLengthDistance(uivector* values, size_t length, size_t distance)
{
  /*values in encoded vector are those used by deflate:
  0-255: literal bytes
  256: end
  257-285: length/distance pair (length code, followed by extra length bits, distance code, extra distance bits)
  286-287: invalid*/

  unsigned length_code = (unsigned)searchCodeIndex(LENGTHBASE, 29, length);
  unsigned extra_length = (unsigned)(length - LENGTHBASE[length_code]);
  unsigned dist_code = (unsigned)searchCodeIndex(DISTANCEBASE, 30, distance);
  unsigned extra_distance = (unsigned)(distance - DISTANCEBASE[dist_code]);

  uivector_push_back(values, length_code + FIRST_LENGTH_CODE_INDEX);
  uivector_push_back(values, extra_length);
  uivector_push_back(values, dist_code);
  uivector_push_back(values, extra_distance);
}